

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

bitboards * FENboardToBitboards(bitboards *__return_storage_ptr__,char *board,int length)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  char array [64];
  char acStack_68 [64];
  
  if (0 < length) {
    uVar4 = 0;
    uVar3 = 0;
    do {
      cVar1 = board[uVar4];
      uVar5 = uVar3;
      if (cVar1 != '/') {
        if ((byte)(cVar1 - 0x31U) < 8) {
          uVar5 = uVar3 + (byte)(cVar1 - 0x30U);
          if ((byte)(cVar1 - 0x30U) != 0) {
            uVar2 = uVar3 + 1;
            if ((int)(uVar3 + 1) < (int)uVar5) {
              uVar2 = uVar5;
            }
            memset(acStack_68 + (int)uVar3,0x20,(ulong)(~uVar3 + uVar2) + 1);
          }
        }
        else {
          acStack_68[(int)uVar3] = cVar1;
          uVar5 = uVar3 + 1;
        }
      }
      uVar4 = uVar4 + 1;
      uVar3 = uVar5;
    } while ((uint)length != uVar4);
  }
  __return_storage_ptr__->BQ = 0;
  __return_storage_ptr__->BK = 0;
  __return_storage_ptr__->BB = 0;
  __return_storage_ptr__->BR = 0;
  __return_storage_ptr__->BP = 0;
  __return_storage_ptr__->BN = 0;
  __return_storage_ptr__->WQ = 0;
  __return_storage_ptr__->WK = 0;
  __return_storage_ptr__->WB = 0;
  __return_storage_ptr__->WR = 0;
  __return_storage_ptr__->WP = 0;
  __return_storage_ptr__->WN = 0;
  (__return_storage_ptr__->castleInfo).whiteACan = true;
  (__return_storage_ptr__->castleInfo).whiteHCan = true;
  (__return_storage_ptr__->castleInfo).blackACan = true;
  (__return_storage_ptr__->castleInfo).blackHCan = true;
  bitboards::standardArrayToBitboards(__return_storage_ptr__,acStack_68);
  return __return_storage_ptr__;
}

Assistant:

bitboards FENboardToBitboards(const char* board, const int length) {
  char array[64];
  int j = 0;
  for(int i = 0; i < length; i++) {
    if(board[i] == '/')
      continue;
    if(board[i] - '1' >= 0 && board[i] - '8' <= 0) {
      int blanks = board[i] - '0';
      for(int k = j; k < j + blanks; k++)
      {
        array[k] = ' ';
      }
      j += blanks;
    }
    else {
      array[j] = board[i];
      j++;
    }
  }

  bitboards returnBoards;
  returnBoards.standardArrayToBitboards(array);
  return returnBoards;
}